

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

longdouble * __thiscall TPZMatrix<long_double>::GetRandomVal(TPZMatrix<long_double> *this)

{
  int iVar1;
  result_type_conflict2 *prVar2;
  longdouble a_random;
  type_conflict2 upper_bound;
  type_conflict2 lower_bound;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa2;
  undefined6 in_stack_ffffffffffffffb2;
  undefined2 in_stack_ffffffffffffffb8;
  undefined2 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc2;
  uniform_real_distribution<long_double> *in_stack_ffffffffffffffd0;
  
  if (GetRandomVal()::unif == '\0') {
    iVar1 = __cxa_guard_acquire(&GetRandomVal()::unif);
    if (iVar1 != 0) {
      in_stack_ffffffffffffff98 = SUB108((longdouble)0,0);
      in_stack_ffffffffffffffa0 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
      std::uniform_real_distribution<long_double>::uniform_real_distribution
                (in_stack_ffffffffffffffd0,
                 (longdouble)CONCAT82(in_stack_ffffffffffffffc2,in_stack_ffffffffffffffc0),
                 (longdouble)
                 CONCAT28(in_stack_ffffffffffffffb8,
                          CONCAT62(in_stack_ffffffffffffffb2,
                                   (short)((unkuint10)(longdouble)1 >> 0x40))));
      __cxa_guard_release(&GetRandomVal()::unif);
    }
  }
  if (GetRandomVal()::re == '\0') {
    iVar1 = __cxa_guard_acquire(&GetRandomVal()::re);
    if (iVar1 != 0) {
      std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
      linear_congruential_engine
                ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x12c6fc1)
      ;
      __cxa_guard_release(&GetRandomVal()::re);
    }
  }
  prVar2 = std::uniform_real_distribution<long_double>::operator()
                     ((uniform_real_distribution<long_double> *)
                      CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  return (longdouble *)prVar2;
}

Assistant:

TVar TPZMatrix<TVar>::GetRandomVal() const{

    if constexpr (std::is_integral_v<TVar> ||
                  std::is_same_v<TVar,TPZFlopCounter>){
        return  ((TVar) rand())/((TVar)RAND_MAX);
    }
    
    else if constexpr (is_fad<TVar>::value){
      constexpr typename TVar::value_type lower_bound = 0;
      constexpr typename TVar::value_type upper_bound = 1;
      static std::uniform_real_distribution<typename TVar::value_type>
        unif(lower_bound,upper_bound);
      static std::default_random_engine re;
      TVar a_random = (TVar)unif(re);
      if constexpr (is_complex<TVar>::value){
        a_random+= (TVar)1i * (TVar)unif(re);
      }
      return a_random;
    }else{
        constexpr RTVar lower_bound = 0;
        constexpr RTVar upper_bound = 1;
        static std::uniform_real_distribution<RTVar> unif(lower_bound,upper_bound);
        static std::default_random_engine re;
        TVar a_random = (TVar)unif(re);
        if constexpr (is_complex<TVar>::value){
            a_random+= (TVar)1i * (TVar)unif(re);
        }
        return a_random;
    }
}